

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::Q3BSPFileImporter::expandFile
          (Q3BSPFileImporter *this,ZipArchiveIOSystem *pArchive,string *rFilename,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rExtList,string *rFile,string *rExt)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  reference pbVar4;
  undefined8 uVar5;
  undefined1 local_78 [8];
  string textureName;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  const_iterator it;
  bool found;
  string *rExt_local;
  string *rFile_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rExtList_local;
  string *rFilename_local;
  ZipArchiveIOSystem *pArchive_local;
  Q3BSPFileImporter *this_local;
  
  if (pArchive == (ZipArchiveIOSystem *)0x0) {
    __assert_fail("__null != pArchive",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                  ,0x2a4,
                  "bool Assimp::Q3BSPFileImporter::expandFile(ZipArchiveIOSystem *, const std::string &, const std::vector<std::string> &, std::string &, std::string &)"
                 );
  }
  bVar1 = std::__cxx11::string::empty();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!rFilename.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                  ,0x2a5,
                  "bool Assimp::Q3BSPFileImporter::expandFile(ZipArchiveIOSystem *, const std::string &, const std::vector<std::string> &, std::string &, std::string &)"
                 );
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(rExtList);
  if (bVar2) {
    std::__cxx11::string::operator=((string *)rFile,(string *)rFilename);
    std::__cxx11::string::operator=((string *)rExt,"");
    this_local._7_1_ = true;
  }
  else {
    it._M_current._7_1_ = 0;
    local_50._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(rExtList);
    while( true ) {
      textureName.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(rExtList);
      bVar2 = __gnu_cxx::operator!=
                        (&local_50,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&textureName.field_2 + 8));
      if (!bVar2) break;
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     rFilename,pbVar4);
      uVar5 = std::__cxx11::string::c_str();
      uVar3 = (*(pArchive->super_IOSystem)._vptr_IOSystem[2])(pArchive,uVar5);
      bVar2 = (uVar3 & 1) != 0;
      if (bVar2) {
        pbVar4 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_50);
        std::__cxx11::string::operator=((string *)rExt,(string *)pbVar4);
        std::__cxx11::string::operator=((string *)rFile,(string *)local_78);
        it._M_current._7_1_ = 1;
      }
      std::__cxx11::string::~string((string *)local_78);
      if (bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_50);
    }
    this_local._7_1_ = (bool)(it._M_current._7_1_ & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool Q3BSPFileImporter::expandFile(ZipArchiveIOSystem *pArchive, const std::string &rFilename,
                                   const std::vector<std::string> &rExtList, std::string &rFile,
                                   std::string &rExt )
{
    ai_assert( NULL != pArchive );
    ai_assert( !rFilename.empty() );

    if ( rExtList.empty() )
    {
        rFile =  rFilename;
        rExt = "";
        return true;
    }

    bool found = false;
    for ( std::vector<std::string>::const_iterator it = rExtList.begin(); it != rExtList.end(); ++it )
    {
        const std::string textureName = rFilename + *it;
        if ( pArchive->Exists( textureName.c_str() ) )
        {
            rExt = *it;
            rFile = textureName;
            found = true;
            break;
        }
    }

    return found;
}